

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,TernaryOp *o)

{
  Expression *pEVar1;
  TernaryOp *o_local;
  ASTVisitor *this_local;
  
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)&o->condition);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)&o->trueBranch);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  pEVar1 = pool_ref::operator_cast_to_Expression_((pool_ref *)&o->falseBranch);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  return;
}

Assistant:

virtual void visit (AST::TernaryOp& o)
    {
        visitObject (o.condition);
        visitObject (o.trueBranch);
        visitObject (o.falseBranch);
    }